

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O2

shared_ptr<mocker::SymTbl::Scope> __thiscall mocker::SymTbl::getScope(SymTbl *this,ScopeID *ids)

{
  ulong *puVar1;
  element_type *peVar2;
  long lVar3;
  out_of_range *this_00;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  ulong *puVar5;
  shared_ptr<mocker::SymTbl::Scope> sVar6;
  
  std::__shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2> *)ids);
  puVar5 = (ulong *)*in_RDX;
  puVar1 = (ulong *)in_RDX[1];
  _Var4._M_pi = extraout_RDX;
  while( true ) {
    if (puVar5 == puVar1) {
      sVar6.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Var4._M_pi;
      sVar6.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<mocker::SymTbl::Scope>)
             sVar6.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>;
    }
    peVar2 = (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    lVar3 = (long)(peVar2->subscopes).
                  super__Vector_base<std::shared_ptr<mocker::SymTbl::Scope>,_std::allocator<std::shared_ptr<mocker::SymTbl::Scope>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)*(pointer *)
                       ((long)&(peVar2->subscopes).
                               super__Vector_base<std::shared_ptr<mocker::SymTbl::Scope>,_std::allocator<std::shared_ptr<mocker::SymTbl::Scope>_>_>
                               ._M_impl.super__Vector_impl_data + 8) - lVar3 >> 4) <= *puVar5)
    break;
    std::__shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2> *)
               (lVar3 + *puVar5 * 0x10));
    puVar5 = puVar5 + 1;
    _Var4._M_pi = extraout_RDX_00;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Scope required does not exist");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

std::shared_ptr<SymTbl::Scope> SymTbl::getScope(const ScopeID &ids) const {
  auto res = root;
  for (const std::size_t i : ids.ids) {
    if (i >= res->subscopes.size())
      throw std::out_of_range("Scope required does not exist");
    res = res->subscopes[i];
  }
  return res;
}